

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

uchar ** traverse<vector_brodnik<unsigned_char*>,void(*)(unsigned_char**,int,int),unsigned_short>
                   (TrieNode<unsigned_short> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  byte bVar1;
  ushort uVar2;
  TrieNode<unsigned_short> *node_00;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  size_t __n;
  long lVar7;
  uchar **__dest;
  byte bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  vector_brodnik<unsigned_char_*> *bucket;
  _func_void_uchar_ptr_ptr_int_int *p_Var12;
  _func_void_uchar_ptr_ptr_int_int *p_Var13;
  
  uVar11 = 0;
  do {
    node_00 = (TrieNode<unsigned_short> *)(node->buckets)._M_elems[uVar11];
    if (((node->is_trie).super__Base_bitset<1024UL>._M_w[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0)
    {
      if (node_00 != (TrieNode<unsigned_short> *)0x0) {
        bVar1 = *(byte *)((long)(node_00->buckets)._M_elems + 0x34);
        small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                     CONCAT71((int7)((ulong)small_sort >> 8),bVar1);
        uVar2 = *(ushort *)((node_00->buckets)._M_elems + 6);
        pvVar3 = (node_00->buckets)._M_elems[5];
        pvVar4 = (node_00->buckets)._M_elems[4];
        pvVar6 = (node_00->buckets)._M_elems[0];
        pvVar5 = (node_00->buckets)._M_elems[1];
        __dest = dst;
        if (pvVar5 != pvVar6) {
          lVar7 = 8;
          p_Var13 = (_func_void_uchar_ptr_ptr_int_int *)0x0;
          lVar9 = 8;
          bVar8 = 0;
          do {
            if (lVar9 != 0) {
              lVar10 = lVar9;
              p_Var12 = p_Var13;
              do {
                small_sort = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[0];
                pvVar5 = (node_00->buckets)._M_elems[1];
                if (p_Var12 ==
                    (_func_void_uchar_ptr_ptr_int_int *)
                    (((long)pvVar5 - (long)small_sort >> 3) + -1)) goto LAB_0020c360;
                if (lVar7 != 0) {
                  memmove(__dest,*(void **)(small_sort + (long)p_Var12 * 8),lVar7 * 8);
                }
                p_Var12 = p_Var12 + 1;
                __dest = __dest + lVar7;
                lVar10 = lVar10 + -1;
              } while (lVar10 != 0);
              pvVar6 = (node_00->buckets)._M_elems[0];
              pvVar5 = (node_00->buckets)._M_elems[1];
            }
            p_Var13 = p_Var13 + lVar9;
            lVar9 = lVar9 << bVar8;
            bVar8 = bVar8 ^ 1;
            lVar7 = lVar7 << bVar8;
            small_sort = (_func_void_uchar_ptr_ptr_int_int *)((long)pvVar5 - (long)pvVar6 >> 3);
          } while (p_Var13 < small_sort);
        }
LAB_0020c360:
        __n = (long)(node_00->buckets)._M_elems[3] - (long)*(void **)((long)pvVar5 + -8);
        if (__n != 0) {
          memmove(__dest,*(void **)((long)pvVar5 + -8),__n);
        }
        lVar7 = ((long)(2 << (bVar1 & 0x1f)) - (long)((ulong)uVar2 * (long)pvVar3 + (long)pvVar4)) +
                -0x40;
        if ((char)uVar11 != '\0') {
          mkqsort(dst,(int)lVar7,(int)depth);
        }
        dst = dst + lVar7;
        vector_brodnik<unsigned_char_*>::~vector_brodnik((vector_brodnik<unsigned_char_*> *)node_00)
        ;
        operator_delete(node_00);
      }
    }
    else {
      dst = traverse<vector_brodnik<unsigned_char*>,void(*)(unsigned_char**,int,int),unsigned_short>
                      (node_00,dst,depth + 2,small_sort);
    }
    uVar11 = uVar11 + 1;
    if (uVar11 == 0x10000) {
      operator_delete(node);
      return dst;
    }
  } while( true );
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}